

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessMemberTestSuite.cpp
# Opt level: O3

bool changeValueOfSimpleMember(void)

{
  Test t;
  
  t.mFoo = 0;
  t.mFoo2 = 1;
  t.mFooBar.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  t.mFooBar.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  t.mFooBar.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  t.mFooBar2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  t.mFooBar2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  t.mFooBar2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined4 *)((long)&t.mFoo + accessor::Proxy<TestFoo,TestFoo>::value) = 100;
  *(undefined4 *)((long)&t.mFoo + accessor::Proxy<TestFoo2,TestFoo2>::value) = 0x65;
  return *(int *)((long)&t.mFoo + accessor::Proxy<TestFoo,TestFoo>::value) == 100;
}

Assistant:

bool changeValueOfSimpleMember()
{
  Test t;

  ::accessor::accessMember<TestFoo>(t).get() = 100;
  ::accessor::accessMember<TestFoo2>(t).get() = 101;
  return (::accessor::accessMember<TestFoo>(t) == 100)
      && (::accessor::accessMember<TestFoo2>(t) == 101);
}